

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::fill<fmt::v7::detail::buffer_appender<char>,char>
          (buffer_appender<char> it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  __type _Var2;
  bool bVar3;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    _Var2 = std::__fill_n_a1<fmt::v7::detail::buffer_appender<char>,unsigned_long,char>
                      (it,n,fill->data_);
    return (buffer_appender<char>)
           _Var2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    it = std::copy_n<char_const*,unsigned_long,fmt::v7::detail::buffer_appender<char>>
                   (fill->data_,(ulong)bVar1,it);
  }
  return (buffer_appender<char>)
         it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}